

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_246d29::BuildEngineImpl::scanRule(BuildEngineImpl *this,RuleInfo *ruleInfo)

{
  RuleScanRecord **__x;
  pointer *ppRVar1;
  StateKind SVar2;
  BuildEngineTrace *pBVar3;
  pointer ppRVar4;
  ulong uVar5;
  pointer this_00;
  pointer pRVar6;
  undefined1 auVar7 [16];
  pointer pRVar8;
  RuleInfo *pRVar9;
  pointer pRVar10;
  bool bVar11;
  bool bVar12;
  undefined6 uVar13;
  int iVar14;
  _func_int **pp_Var15;
  ulong uVar16;
  ulong *puVar17;
  anon_union_8_2_b9ac6d26_for_inProgressInfo aVar18;
  _Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  *this_01;
  pointer pRVar19;
  pointer pRVar20;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__s;
  size_t __n;
  pointer pRVar21;
  Rule *forRule;
  Rule *pRVar22;
  BuildEngineDelegate *pBVar23;
  ulong uVar24;
  long lVar25;
  pointer pRVar26;
  undefined8 uStack_40;
  
  SVar2 = ruleInfo->state;
  if (SVar2 == Complete) {
    if ((ruleInfo->result).builtAt == this->currentEpoch) {
      return true;
    }
  }
  else {
    if (1 < (int)SVar2) {
      return true;
    }
    if (SVar2 == IsScanning) {
      return false;
    }
  }
  llbuild::core::DependencyKeyIDs::cleanSingleUseDependencies(&(ruleInfo->result).dependencies);
  pBVar3 = (this->trace)._M_t.
           super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
           .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
  if (pBVar3 != (BuildEngineTrace *)0x0) {
    llbuild::core::BuildEngineTrace::checkingRuleNeedsToRun
              (pBVar3,(ruleInfo->rule)._M_t.
                      super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                      .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
  }
  pRVar22 = (ruleInfo->rule)._M_t.
            super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
            _M_t.
            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
  (*pRVar22->_vptr_Rule[4])(pRVar22,this->buildEngine,0);
  ruleInfo->wasForced = false;
  if ((ruleInfo->result).builtAt == 0) {
    pBVar3 = (this->trace)._M_t.
             super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
             .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
    if (pBVar3 != (BuildEngineTrace *)0x0) {
      llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseNeverBuilt
                (pBVar3,(ruleInfo->rule)._M_t.
                        super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                        .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
    }
    ruleInfo->state = NeedsToRun;
    pBVar23 = this->delegate;
    pRVar22 = (ruleInfo->rule)._M_t.
              super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
              _M_t.
              super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
              .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
    pp_Var15 = pBVar23->_vptr_BuildEngineDelegate;
    uStack_40 = 0;
  }
  else {
    pRVar22 = (ruleInfo->rule)._M_t.
              super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
              _M_t.
              super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
              .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
    if ((pRVar22->signature).value == (ruleInfo->result).signature.value) {
      forRule = (Rule *)this->buildEngine;
      iVar14 = (*pRVar22->_vptr_Rule[3])(pRVar22,forRule,&ruleInfo->result);
      if ((char)iVar14 != '\0') {
        pBVar3 = (this->trace)._M_t.
                 super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
        if ((ruleInfo->result).dependencies.keys.
            super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (ruleInfo->result).dependencies.keys.
            super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (pBVar3 != (BuildEngineTrace *)0x0) {
            llbuild::core::BuildEngineTrace::ruleDoesNotNeedToRun
                      (pBVar3,(ruleInfo->rule)._M_t.
                              super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                              .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
          }
          ruleInfo->state = DoesNotNeedToRun;
          return true;
        }
        __s = extraout_RDX;
        if (pBVar3 != (BuildEngineTrace *)0x0) {
          forRule = (ruleInfo->rule)._M_t.
                    super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                    .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
          llbuild::core::BuildEngineTrace::ruleScheduledForScanning(pBVar3,forRule);
          __s = extraout_RDX_00;
        }
        ruleInfo->state = IsScanning;
        ppRVar4 = (this->freeRuleScanRecords).
                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->freeRuleScanRecords).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_start == ppRVar4) {
          __x = &this->currentBlockPos;
          aVar18 = (anon_union_8_2_b9ac6d26_for_inProgressInfo)this->currentBlockPos;
          if (aVar18.pendingScanRecord == this->currentBlockEnd) {
            uVar5 = this->numScanRecordsPerBlock;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar5;
            uVar16 = SUB168(auVar7 * ZEXT816(0x30),0);
            uVar24 = 0xffffffffffffffff;
            if (SUB168(auVar7 * ZEXT816(0x30),8) == 0) {
              uVar24 = uVar16 | 8;
            }
            puVar17 = (ulong *)operator_new__(uVar24);
            *puVar17 = uVar5;
            if (uVar5 != 0) {
              memset((RuleScanRecord *)(puVar17 + 1),0,uVar16 - (uVar16 - 0x30) % 0x30);
            }
            this->currentBlockPos = (RuleScanRecord *)(puVar17 + 1);
            forRule = (Rule *)__x;
            std::
            vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
            ::push_back(&this->ruleScanRecordBlocks,__x);
            aVar18 = (anon_union_8_2_b9ac6d26_for_inProgressInfo)this->currentBlockPos;
            this->currentBlockEnd = aVar18.pendingScanRecord + this->numScanRecordsPerBlock;
            __s = extraout_RDX_01;
          }
          *__x = (RuleScanRecord *)
                 &((aVar18.pendingTaskInfo)->deferredScanRequests).
                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          aVar18 = *(anon_union_8_2_b9ac6d26_for_inProgressInfo *)(ppRVar4 + -1);
          (this->freeRuleScanRecords).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppRVar4 + -1;
        }
        ruleInfo->inProgressInfo = aVar18;
        pRVar21 = (this->ruleInfosToScan).
                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pRVar21 ==
            (this->ruleInfosToScan).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_01 = (_Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                     *)std::
                       vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                       ::_M_check_len(&this->ruleInfosToScan,(size_type)forRule,__s);
          this_00 = (this->ruleInfosToScan).
                    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pRVar6 = (this->ruleInfosToScan).
                   super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar25 = (long)pRVar21 - (long)this_00;
          pRVar19 = std::
                    _Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                    ::_M_allocate(this_01,(size_t)forRule);
          *(RuleInfo **)((long)pRVar19 + lVar25) = ruleInfo;
          *(undefined4 *)((long)pRVar19 + lVar25 + 8) = 0;
          *(undefined8 *)((long)pRVar19 + lVar25 + 0x10) = 0;
          *(undefined2 *)((long)pRVar19 + lVar25 + 0x18) = 0;
          pRVar8 = pRVar19;
          for (pRVar20 = this_00; pRVar26 = pRVar8 + 1, pRVar20 != pRVar21; pRVar20 = pRVar20 + 1) {
            pRVar9 = (RuleInfo *)
                     (((_Vector_impl *)&pRVar20->ruleInfo)->super__Vector_impl_data)._M_start;
            pRVar10 = *(pointer *)&pRVar20->inputIndex;
            bVar11 = pRVar20->orderOnly;
            bVar12 = pRVar20->singleUse;
            uVar13 = *(undefined6 *)&pRVar20->field_0x1a;
            pRVar8->inputRuleInfo = pRVar20->inputRuleInfo;
            pRVar8->orderOnly = bVar11;
            pRVar8->singleUse = bVar12;
            *(undefined6 *)&pRVar8->field_0x1a = uVar13;
            pRVar8->ruleInfo = pRVar9;
            *(pointer *)&pRVar8->inputIndex = pRVar10;
            pRVar8 = pRVar26;
          }
          for (; pRVar21 != pRVar6; pRVar21 = pRVar21 + 1) {
            pRVar9 = (RuleInfo *)
                     (((_Vector_impl *)&pRVar21->ruleInfo)->super__Vector_impl_data)._M_start;
            pRVar8 = *(pointer *)&pRVar21->inputIndex;
            bVar11 = pRVar21->orderOnly;
            bVar12 = pRVar21->singleUse;
            uVar13 = *(undefined6 *)&pRVar21->field_0x1a;
            pRVar26->inputRuleInfo = pRVar21->inputRuleInfo;
            pRVar26->orderOnly = bVar11;
            pRVar26->singleUse = bVar12;
            *(undefined6 *)&pRVar26->field_0x1a = uVar13;
            pRVar26->ruleInfo = pRVar9;
            *(pointer *)&pRVar26->inputIndex = pRVar8;
            pRVar26 = pRVar26 + 1;
          }
          std::
          _Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ::_M_deallocate((_Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                           *)this_00,
                          (pointer)((long)(this->ruleInfosToScan).
                                          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_00 >> 5),__n);
          (this->ruleInfosToScan).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ._M_impl.super__Vector_impl_data._M_start = pRVar19;
          (this->ruleInfosToScan).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish = pRVar26;
          (this->ruleInfosToScan).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar19 + (long)this_01;
        }
        else {
          pRVar21->ruleInfo = ruleInfo;
          pRVar21->inputIndex = 0;
          pRVar21->inputRuleInfo = (RuleInfo *)0x0;
          pRVar21->orderOnly = false;
          pRVar21->singleUse = false;
          ppRVar1 = &(this->ruleInfosToScan).
                     super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppRVar1 = *ppRVar1 + 1;
        }
        return false;
      }
      pBVar3 = (this->trace)._M_t.
               super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
      if (pBVar3 != (BuildEngineTrace *)0x0) {
        llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseInvalidValue
                  (pBVar3,(ruleInfo->rule)._M_t.
                          super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                          .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
      }
      ruleInfo->state = NeedsToRun;
      pBVar23 = this->delegate;
      pRVar22 = (ruleInfo->rule)._M_t.
                super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                ._M_t.
                super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
      pp_Var15 = pBVar23->_vptr_BuildEngineDelegate;
      uStack_40 = 2;
    }
    else {
      pBVar3 = (this->trace)._M_t.
               super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
      if (pBVar3 != (BuildEngineTrace *)0x0) {
        llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseSignatureChanged(pBVar3,pRVar22);
        pRVar22 = (ruleInfo->rule)._M_t.
                  super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                  .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
      }
      ruleInfo->state = NeedsToRun;
      pBVar23 = this->delegate;
      pp_Var15 = pBVar23->_vptr_BuildEngineDelegate;
      uStack_40 = 1;
    }
  }
  (*pp_Var15[4])(pBVar23,pRVar22,uStack_40,0);
  return true;
}

Assistant:

bool scanRule(RuleInfo& ruleInfo) {
    // If the rule is already scanned, we are done.
    if (ruleInfo.isScanned(this))
      return true;

    // If the rule is being scanned, we don't need to do anything.
    if (ruleInfo.isScanning())
      return false;
    
    /// Cleans up single use dependencies that should not be considered for incremental builds.
    ruleInfo.result.dependencies.cleanSingleUseDependencies();

    // Otherwise, start scanning the rule.
    if (trace)
      trace->checkingRuleNeedsToRun(ruleInfo.rule.get());

    // Report the status change.
    ruleInfo.rule->updateStatus(buildEngine, Rule::StatusKind::IsScanning);

    ruleInfo.wasForced = false;

    // If the rule has never been run, it needs to run.
    if (ruleInfo.result.builtAt == 0) {
      if (trace)
        trace->ruleNeedsToRunBecauseNeverBuilt(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::NeverBuilt, nullptr);
      return true;
    }

    if (ruleInfo.rule->signature != ruleInfo.result.signature) {
      if (trace)
        trace->ruleNeedsToRunBecauseSignatureChanged(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::SignatureChanged, nullptr);
      return true;
    }

    // If the rule indicates its computed value is out of date, it needs to run.
    //
    // FIXME: We should probably try and move this so that it can be done by
    // clients in the background, either by us backgrounding it, or by using a
    // completion model as we do for inputs.
    if (!ruleInfo.rule->isResultValid(buildEngine, ruleInfo.result.value)) {
      if (trace)
        trace->ruleNeedsToRunBecauseInvalidValue(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::NeedsToRun;
      delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::InvalidValue, nullptr);
      return true;
    }

    // If the rule has no dependencies, then it is ready to run.
    if (ruleInfo.result.dependencies.empty()) {
      if (trace)
        trace->ruleDoesNotNeedToRun(ruleInfo.rule.get());
      ruleInfo.state = RuleInfo::StateKind::DoesNotNeedToRun;
      return true;
    }

    // Otherwise, we need to do a recursive scan of the inputs so enqueue this
    // rule for scanning.
    //
    // We could also take an approach where we enqueue each of the individual
    // inputs, but in my experiments with that approach it has always performed
    // significantly worse.
    if (trace)
      trace->ruleScheduledForScanning(ruleInfo.rule.get());
    ruleInfo.state = RuleInfo::StateKind::IsScanning;
    ruleInfo.setPendingScanRecord(newRuleScanRecord());
    ruleInfosToScan.push_back({ &ruleInfo, /*InputIndex=*/0, nullptr, false });

    return false;
  }